

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,false>::
SetPropertyFromDescriptor<false,int>
          (SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,false> *this,
          DynamicObject *instance,PropertyId propertyId,int propertyKey,
          SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor,Var value,
          PropertyOperationFlags flags,PropertyValueInfo *info)

{
  Type *pTVar1;
  ScriptContext *this_00;
  JavascriptString *str1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  PropertyAttributes PVar5;
  byte bVar6;
  int iVar7;
  BOOL BVar8;
  undefined4 *puVar9;
  JavascriptString **ppJVar10;
  UndeclaredBlockVariable *pUVar11;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> *pSVar12;
  PropertyRecord *pPVar13;
  unsigned_short uVar14;
  ulong uVar15;
  _func_int *UNRECOVERED_JUMPTABLE;
  ushort local_42;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *pSStack_40;
  unsigned_short propertyIndex;
  PropertyOperationFlags local_34;
  
  local_34 = flags;
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    pSStack_40 = descriptor;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x526,"(instance)","instance");
    if (!bVar3) goto LAB_00cafd2a;
    *puVar9 = 0;
    descriptor = pSStack_40;
  }
  bVar4 = descriptor->Attributes;
  if ((bVar4 & 0x10) != 0) {
    pSVar12 = (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> *)
              SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::
              ConvertToDictionaryType
                        ((SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>
                          *)this,instance);
    UNRECOVERED_JUMPTABLE = (pSVar12->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x17];
    uVar15 = (ulong)(uint)propertyId;
LAB_00caf7f3:
    iVar7 = (*UNRECOVERED_JUMPTABLE)(pSVar12,instance,uVar15,value,(ulong)local_34,info);
    return iVar7;
  }
  pTVar1 = (instance->super_RecyclableObject).type.ptr;
  this_00 = (((pTVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  if ((bVar4 & 8) == 0) {
    if ((local_34 & PropertyOperation_AllowUndeclInConsoleScope) == PropertyOperation_None &&
        (bVar4 & 4) == 0) {
      JavascriptError::ThrowCantAssignIfStrictMode(local_34,this_00);
      if (info == (PropertyValueInfo *)0x0) {
        return 0;
      }
      info->m_instance = &instance->super_RecyclableObject;
      info->m_propertyIndex = 0xffff;
      info->m_attributes = '\0';
      info->flags = InlineCacheNoFlags;
      return 0;
    }
  }
  else {
    if (((byte)this[9] & 4) != 0) {
      pSVar12 = SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::
                ConvertToNonSharedSimpleDictionaryType
                          ((SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>
                            *)this,instance);
      UNRECOVERED_JUMPTABLE = (pSVar12->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x17];
      uVar15 = (ulong)(uint)propertyKey;
      goto LAB_00caf7f3;
    }
    pSStack_40 = descriptor;
    if (*(char *)&pTVar1[1].javascriptLibrary.ptr == '\x01') {
      if ((((byte)this[9] & 0x10) != 0) ||
         (*(char *)((long)&pTVar1[1].javascriptLibrary.ptr + 1) == '\x01')) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x547,
                                    "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())"
                                    ,"!GetIsShared() && !instance->GetDynamicType()->GetIsShared()")
        ;
        if (!bVar3) goto LAB_00cafd2a;
        *puVar9 = 0;
      }
      DynamicObject::ChangeType(instance);
    }
    if ((((byte)this[0x28] & 2) != 0) &&
       (bVar3 = SimpleDictionaryUnorderedTypeHandler<unsigned_short,_Js::JavascriptString_*,_false>
                ::TryUndeleteProperty
                          ((SimpleDictionaryUnorderedTypeHandler<unsigned_short,_Js::JavascriptString_*,_false>
                            *)this,instance,pSStack_40->propertyIndex,&local_42), bVar3)) {
      ppJVar10 = JsUtil::
                 BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                 ::GetKeyAt(*(BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                              **)(this + 0x18),(uint)local_42);
      str1 = *ppJVar10;
      pPVar13 = ScriptContext::GetPropertyName(this_00,propertyKey);
      bVar3 = PropertyRecordStringHashComparer<Js::JavascriptString_*>::Equals(str1,pPVar13);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x55e,
                                    "(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey)))"
                                    ,
                                    "PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey))"
                                   );
        if (!bVar3) goto LAB_00cafd2a;
        *puVar9 = 0;
      }
      pSStack_40 = JsUtil::
                   BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                   ::GetReferenceAt(*(BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                                      **)(this + 0x18),(uint)local_42);
    }
    bVar3 = SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::
            SupportsSwitchingToUnordered
                      ((SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>
                        *)this,this_00);
    if (bVar3) {
      this[0x29] = (SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,false>)
                   ((char)this[0x29] + -1);
    }
    pSStack_40->Attributes = '\a';
    DynamicObject::SetHasNoEnumerableProperties(instance,false);
    if (propertyKey != -1) {
      ScriptContext::InvalidateProtoCaches(this_00,propertyKey);
    }
    pSStack_40->Attributes = '\a';
    bVar4 = 7;
    descriptor = pSStack_40;
    propertyId = propertyKey;
  }
  if (descriptor->propertyIndex == 0xffff) goto LAB_00cafcaf;
  pSStack_40 = descriptor;
  if (((-1 < (char)(undefined1)local_34 && 0x3f < bVar4) &&
      (pUVar11 = (UndeclaredBlockVariable *)
                 DynamicObject::GetSlot(instance,(uint)descriptor->propertyIndex),
      (local_34 >> 8 & 1) == 0)) &&
     ((((this_00->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).ptr ==
      pUVar11)) {
    JavascriptError::ThrowReferenceError(this_00,-0x7ff5ec07,(PCWSTR)0x0);
  }
  if (*(long **)(this + 0x20) == (long *)0x0) {
    bVar3 = false;
  }
  else if ((DynamicObject *)**(long **)(this + 0x20) == instance) {
    bVar3 = true;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x588,
                                "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                ,
                                "this->singletonInstance == nullptr || localSingletonInstance == instance"
                               );
    if (!bVar3) goto LAB_00cafd2a;
    *puVar9 = 0;
    bVar3 = false;
  }
  if ((*(byte *)pSStack_40 & 2) == 0) {
    if ((((local_34 & PropertyOperation_PreInit) == PropertyOperation_None) &&
        (*(byte *)pSStack_40 = *(byte *)pSStack_40 | 2, bVar3)) &&
       ((local_34 & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
        PropertyOperation_None && 0xf < (uint)propertyKey)) {
      if (((byte)this[9] & 0x10) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x594,"(!GetIsShared())","!GetIsShared()");
        if (!bVar3) goto LAB_00cafd2a;
        *puVar9 = 0;
      }
      if (value == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x595,"(value != nullptr)","value != nullptr");
        if (!bVar3) goto LAB_00cafd2a;
        *puVar9 = 0;
      }
      BVar8 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
      if (BVar8 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x597,"(!instance->IsExternal())","!instance->IsExternal()");
        if (!bVar3) {
LAB_00cafd2a:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar9 = 0;
      }
      bVar3 = VarIs<Js::JavascriptFunction>(value);
      if (bVar3) {
        bVar3 = DynamicTypeHandler::ShouldFixMethodProperties();
LAB_00cafd05:
        bVar4 = *(byte *)pSStack_40;
        if (bVar3 == false) goto LAB_00cafd1b;
        bVar6 = 4;
      }
      else {
        bVar3 = DynamicTypeHandler::ShouldFixDataProperties();
        if (bVar3) {
          bVar3 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps(instance,propertyId,value);
          goto LAB_00cafd05;
        }
        bVar4 = *(byte *)pSStack_40;
LAB_00cafd1b:
        bVar6 = 0;
      }
      *(byte *)pSStack_40 = bVar4 & 0xfb | bVar6;
    }
  }
  else {
    pPVar13 = ScriptContext::GetPropertyName(this_00,propertyKey);
    InvalidateFixedField<Js::PropertyRecord_const*>
              (this,pPVar13,pSStack_40,
               (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr);
  }
  DynamicTypeHandler::SetSlotUnchecked(instance,(uint)pSStack_40->propertyIndex,value);
  if (((uint)*pSStack_40 & 6) == 2) {
    if (info == (PropertyValueInfo *)0x0) goto LAB_00cafcaf;
    PVar5 = pSStack_40->Attributes;
    uVar14 = pSStack_40->propertyIndex;
  }
  else {
    if (info == (PropertyValueInfo *)0x0) goto LAB_00cafcaf;
    uVar14 = 0xffff;
    PVar5 = '\0';
  }
  info->m_instance = &instance->super_RecyclableObject;
  info->m_propertyIndex = uVar14;
  info->m_attributes = PVar5;
  info->flags = InlineCacheNoFlags;
LAB_00cafcaf:
  TPropertyKey_GetUpdateSideEffectPropertyId<int>(propertyId,propertyKey);
  if (propertyKey != -1) {
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              ((DynamicTypeHandler *)this,instance,propertyKey,value,SideEffects_Any);
  }
  return 1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetPropertyFromDescriptor(DynamicObject* instance, PropertyId propertyId, TPropertyKey propertyKey, SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        Assert(instance);
        ScriptContext* scriptContext = instance->GetScriptContext();
        bool throwIfNotExtensible = (flags & (PropertyOperation_ThrowIfNotExtensible | PropertyOperation_StrictMode)) != 0;

        if (!allowLetConstGlobal && (descriptor->Attributes & PropertyLetConstGlobal))
        {
            // We have a shadowing case here.  An undeclared global property
            // is being added after a let/const was already declared.
            //
            // SimpleDictionaryTypeHandlerBase does not handle shadowed globals
            // because we do not want to add another property index field to the
            // property descriptors.  Instead convert to DictionaryTypeHandler
            // where it will reuse one of the getter/setter fields on its
            // property descriptor type.
            return
                ConvertToDictionaryType(instance)
                    ->SetProperty(
                            instance,
                            propertyId,
                            value,
                            flags,
                            info);
        }

        if (descriptor->Attributes & PropertyDeleted)
        {
            if(GetIsLocked())
            {
                return
                    ConvertToNonSharedSimpleDictionaryType(instance)->SetProperty(instance, propertyKey, value, flags, info);
            }
            else if (instance->GetDynamicType()->GetIsLocked())
            {
                Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                instance->ChangeType();
            }

            if (IsNotExtensibleSupported)
            {
                bool isForce = (flags & PropertyOperation_Force) != 0;
                if (!isForce)
                {
                    if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
                    {
                        return FALSE;
                    }
                }
            }

            if(isUnordered)
            {
                TPropertyIndex propertyIndex;
                if(AsUnordered()->TryUndeleteProperty(instance, descriptor->propertyIndex, &propertyIndex))
                {
                    Assert(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey)));
                    descriptor = propertyMap->GetReferenceAt(propertyIndex);
                }
            }

            if(SupportsSwitchingToUnordered(scriptContext))
            {
                --numDeletedProperties;
            }
            descriptor->Attributes = PropertyDynamicTypeDefaults;
            instance->SetHasNoEnumerableProperties(false);
            propertyId = TPropertyKey_GetOptionalPropertyId(instance->GetScriptContext(), propertyKey);
            if (propertyId != Constants::NoProperty)
            {
                scriptContext->InvalidateProtoCaches(propertyId);
            }
            descriptor->Attributes = PropertyDynamicTypeDefaults;
        }
        else if (!(descriptor->Attributes & PropertyWritable) && !(flags & PropertyOperation_AllowUndeclInConsoleScope))
        {
            JavascriptError::ThrowCantAssignIfStrictMode(flags, scriptContext);

            // Since we separate LdFld and StFld caches there is no point in caching for StFld with non-writable properties, except perhaps
            // to prepopulate the type property cache (which we do share between LdFld and StFld), for potential future field loads. This
            // would require additional handling in CacheOperators::CachePropertyWrite, such that for !info-IsWritable() we don't populate
            // the local cache (that would be illegal), but still populate the type's property cache.
            PropertyValueInfo::SetNoCache(info, instance);
            return false;
        }

        if (descriptor->propertyIndex != NoSlots)
        {
            if ((descriptor->Attributes & PropertyNoRedecl) && !(flags & PropertyOperation_AllowUndecl))
            {
                if (scriptContext->IsUndeclBlockVar(instance->GetSlot(descriptor->propertyIndex)) && !(flags & PropertyOperation_AllowUndeclInConsoleScope))
                {
                    JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
                }
            }

#if ENABLE_FIXED_FIELDS
            DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
            Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);
            if (!descriptor->isInitialized)
            {
                if ((flags & PropertyOperation_PreInit) == 0)
                {
                    // Consider: It would be nice to assert the slot is actually null.  However, we sometimes pre-initialize to undefined or even
                    // some other special illegal value (for let or const), currently == null.
                    descriptor->isInitialized = true;
                    if (localSingletonInstance == instance &&
                        !TPropertyKey_IsInternalPropertyId(propertyKey) &&
                        (flags & (PropertyOperation_NonFixedValue | PropertyOperation_SpecialValue)) == 0)
                    {
                        Assert(!GetIsShared());
                        Assert(value != nullptr);
                        // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                        Assert(!instance->IsExternal());
                        descriptor->isFixed = (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyId, value)));
                    }
                }
            }
            else
            {
                InvalidateFixedField(TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey), descriptor, instance->GetScriptContext());
            }
#endif

            SetSlotUnchecked(instance, descriptor->propertyIndex, value);

            if (!descriptor->IsOrMayBecomeFixed())
            {
                SetPropertyValueInfoNonFixed(info, instance, descriptor->propertyIndex, descriptor->Attributes);
            }
            else
            {
                PropertyValueInfo::SetNoCache(info, instance);
            }
        }

        propertyId = TPropertyKey_GetUpdateSideEffectPropertyId(propertyId, propertyKey);
        if (propertyId != Constants::NoProperty)
        {
            SetPropertyUpdateSideEffect(instance, propertyId, value, SideEffects_Any);
        }
        return true;
    }